

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O1

bool __thiscall pgn::find_move<(Piece)5>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  byte bVar1;
  U8 UVar2;
  bool bVar3;
  U8 UVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Move *m_00;
  ulong uVar9;
  U8 *pUVar10;
  bool bVar11;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  uVar6 = (&bitboards::kmask)[*local_3a8.kings];
  uVar8 = local_3a8.enemies & uVar6;
  UVar2 = (U8)*local_3a8.kings;
  if (uVar8 != 0) {
    uVar9 = (ulong)local_3a8.last;
    pUVar10 = &local_3a8.list[uVar9].type;
    do {
      lVar7 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      ((Move *)(pUVar10 + -2))->f = UVar2;
      pUVar10[-1] = (U8)lVar7;
      *pUVar10 = '\v';
      pUVar10 = pUVar10 + 3;
      local_3a8.last = (int)uVar9 + 1;
      uVar9 = (ulong)(uint)local_3a8.last;
      uVar8 = uVar8 & uVar8 - 1;
    } while (uVar8 != 0);
  }
  uVar6 = uVar6 & local_3a8.empty;
  if (uVar6 != 0) {
    uVar8 = (ulong)local_3a8.last;
    pUVar10 = &local_3a8.list[uVar8].type;
    do {
      lVar7 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      ((Move *)(pUVar10 + -2))->f = UVar2;
      pUVar10[-1] = (U8)lVar7;
      *pUVar10 = '\n';
      pUVar10 = pUVar10 + 3;
      local_3a8.last = (int)uVar8 + 1;
      uVar8 = (ulong)(uint)local_3a8.last;
      uVar6 = uVar6 & uVar6 - 1;
    } while (uVar6 != 0);
  }
  if (local_3a8.can_castle_ks == true) {
    lVar7 = (long)local_3a8.last;
    local_3a8.last = local_3a8.last + 1;
    UVar4 = '>';
    if (local_3a8.us == white) {
      UVar4 = '\x06';
    }
    local_3a8.list[lVar7].f = UVar2;
    local_3a8.list[lVar7].t = UVar4;
    local_3a8.list[lVar7].type = '\b';
  }
  if (local_3a8.can_castle_qs == true) {
    lVar7 = (long)local_3a8.last;
    local_3a8.last = local_3a8.last + 1;
    UVar4 = ':';
    if (local_3a8.us == white) {
      UVar4 = '\x02';
    }
    local_3a8.list[lVar7].f = UVar2;
    local_3a8.list[lVar7].t = UVar4;
    local_3a8.list[lVar7].type = '\t';
  }
  bVar11 = 0 < local_3a8.last;
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar7 = 0;
    do {
      bVar3 = position::is_legal(p,m_00);
      if (bVar3) {
        if (UVar2 == '\x11') {
          bVar1 = m_00->t;
          if (*to == (uint)bVar1) {
            if (((row < 0) || (bVar5 = m_00->f, (uint)(bVar5 >> 3) != row)) &&
               ((col < 0 || (bVar5 = m_00->f, (bVar5 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011deb8;
              m->f = m_00->f;
            }
            else {
              m->f = bVar5;
            }
            m->t = bVar1;
            UVar4 = m_00->type;
LAB_0011df02:
            m->type = UVar4;
            break;
          }
        }
        else {
          UVar4 = m_00->type;
          if ((m->type == UVar4) && (bVar1 = m_00->t, *to == (uint)bVar1)) {
            if (((row < 0) || (bVar5 = m_00->f, (uint)(bVar5 >> 3) != row)) &&
               ((col < 0 || (bVar5 = m_00->f, (bVar5 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011deb8;
              m->f = m_00->f;
            }
            else {
              m->f = bVar5;
            }
            m->t = bVar1;
            goto LAB_0011df02;
          }
        }
      }
LAB_0011deb8:
      lVar7 = lVar7 + 1;
      m_00 = m_00 + 1;
      bVar11 = lVar7 < local_3a8.last;
    } while (lVar7 < local_3a8.last);
  }
  Movegen::~Movegen(&local_3a8);
  return bVar11;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}